

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# name_resolver.cc
# Opt level: O2

string * __thiscall
google::protobuf::compiler::java::ClassNameResolver::GetClassName_abi_cxx11_
          (string *__return_storage_ptr__,ClassNameResolver *this,Descriptor *descriptor,
          bool immutable,bool kotlin)

{
  FileDescriptor *file;
  bool bVar1;
  string_view name_without_package;
  string local_50;
  
  java::(anonymous_namespace)::ClassNameWithoutPackage_abi_cxx11_
            (&local_50,(_anonymous_namespace_ *)descriptor,descriptor,immutable);
  file = descriptor->file_;
  bVar1 = NestedInFileClass(descriptor,immutable);
  name_without_package._M_str = local_50._M_dataplus._M_p;
  name_without_package._M_len = local_50._M_string_length;
  GetClassFullName_abi_cxx11_
            (__return_storage_ptr__,this,name_without_package,file,immutable,!bVar1,kotlin);
  std::__cxx11::string::~string((string *)&local_50);
  return __return_storage_ptr__;
}

Assistant:

std::string ClassNameResolver::GetClassName(const Descriptor* descriptor,
                                            bool immutable, bool kotlin) {
  return GetClassFullName(ClassNameWithoutPackage(descriptor, immutable),
                          descriptor->file(), immutable,
                          !NestedInFileClass(*descriptor, immutable), kotlin);
}